

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::LowerNewScObject
          (Lowerer *this,Instr *newObjInstr,bool callCtor,bool hasArgs,
          bool isBaseClassConstructorNewScObject)

{
  OpCode OVar1;
  Func *func;
  Lowerer *this_00;
  Func *pFVar2;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  byte bVar6;
  ExecutionMode EVar7;
  ArgSlot AVar8;
  Instr *pIVar9;
  undefined4 *puVar10;
  Lowerer *newObjDst;
  LabelInstr *helperOrBailoutLabel;
  LabelInstr *callCtorLabel;
  Lowerer *pLVar11;
  FixedFieldInfo *this_01;
  intptr_t iVar12;
  intptr_t iVar13;
  Opnd *opndArg;
  HelperCallOpnd *pHVar14;
  Instr *pIVar15;
  RegOpnd *opnd;
  Lowerer *resultObjOpnd;
  IntConstOpnd *callInfo;
  JnHelperMethod JVar16;
  RegOpnd *this_02;
  char *this_03;
  byte bVar17;
  byte bVar18;
  JnHelperMethod JVar19;
  undefined1 local_b0 [8];
  AutoReuseOpnd autoReuseSavedCtorOpnd;
  Instr *startCallInstr;
  Instr *local_60;
  bool local_35;
  bool local_34;
  bool local_33;
  byte local_32;
  byte local_31;
  bool skipNewScObj;
  bool returnNewScObj;
  bool emitBailOut;
  
  if ((newObjInstr->m_kind == InstrKindJitProfiling) &&
     ((newObjInstr[1].m_noLazyHelperAssert & 4U) != 0)) {
    if (!callCtor) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x117d,"(callCtor)","callCtor");
      if (!bVar5) goto LAB_005a5b2f;
      *puVar10 = 0;
    }
    if (newObjInstr->m_kind != InstrKindJitProfiling) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,199,"(this->IsJitProfilingInstr())","Bad call to AsProfiledInstr()");
      if (!bVar5) goto LAB_005a5b2f;
      *puVar10 = 0;
    }
    pIVar9 = LowerProfiledNewArray(this,(JitProfilingInstr *)newObjInstr,false);
    return pIVar9;
  }
  OVar1 = newObjInstr->m_opcode;
  func = newObjInstr->m_func;
  pIVar9 = InsertLoweredRegionStartMarker(this,newObjInstr);
  this_00 = (Lowerer *)newObjInstr->m_dst;
  this_02 = (RegOpnd *)newObjInstr->m_src1;
  OVar4 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_005a5b2f;
    *puVar10 = 0;
  }
  if ((callCtor && hasArgs) && (newObjInstr->m_src2 == (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x118e,"(!callCtor || !hasArgs || (newObjInstr->GetSrc2() != nullptr ))",
                       "!callCtor || !hasArgs || (newObjInstr->GetSrc2() != nullptr )");
    if (!bVar5) goto LAB_005a5b2f;
    *puVar10 = 0;
  }
  local_35 = false;
  local_34 = false;
  local_33 = false;
  newObjDst = this_00;
  if (callCtor) {
    newObjDst = (Lowerer *)IR::RegOpnd::New(TyVar,func);
  }
  helperOrBailoutLabel = IR::LabelInstr::New(Label,func,true);
  callCtorLabel = IR::LabelInstr::New(Label,func,false);
  local_32 = TryLowerNewScObjectWithFixedCtorCache
                       (this,newObjInstr,(RegOpnd *)newObjDst,helperOrBailoutLabel,callCtorLabel,
                        &local_35,&local_34,&local_33);
  bVar18 = local_35 ^ 1;
  local_31 = local_35;
  if (bVar18 == 0 && !callCtor) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x119c,"(!skipNewScObj || callCtor)",
                       "What will we return if we skip the default new object and don\'t call the ctor?"
                      );
    if (!bVar5) goto LAB_005a5b2f;
    *puVar10 = 0;
  }
  if ((local_31 != 0) && (local_34 == true)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x119d,"(!skipNewScObj || !returnNewScObj)",
                       "!skipNewScObj || !returnNewScObj");
    if (!bVar5) goto LAB_005a5b2f;
    *puVar10 = 0;
  }
  if (local_32 == 0) {
    if (local_31 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x119e,"(usedFixedCtorCache || !skipNewScObj)",
                         "usedFixedCtorCache || !skipNewScObj");
      if (!bVar5) goto LAB_005a5b2f;
      *puVar10 = 0;
    }
    bVar6 = local_31;
    if (local_32 != 0) goto LAB_005a4ea1;
  }
  else {
LAB_005a4ea1:
    bVar6 = local_31;
    bVar5 = IR::Instr::HasFixedFunctionAddressTarget(newObjInstr);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x119f,
                         "(!usedFixedCtorCache || newObjInstr->HasFixedFunctionAddressTarget())",
                         "!usedFixedCtorCache || newObjInstr->HasFixedFunctionAddressTarget()");
      if (!bVar5) goto LAB_005a5b2f;
      *puVar10 = 0;
      bVar6 = local_31;
    }
  }
  if ((bVar6 != 0) && (local_33 == true)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x11a0,"(!skipNewScObj || !emitBailOut)","!skipNewScObj || !emitBailOut");
    if (!bVar5) goto LAB_005a5b2f;
    *puVar10 = 0;
    bVar6 = local_31;
  }
  autoReuseSavedCtorOpnd.autoDelete = false;
  autoReuseSavedCtorOpnd.wasInUse = false;
  autoReuseSavedCtorOpnd._18_6_ = 0;
  if (callCtor && hasArgs) {
    bVar5 = IR::Instr::HasEmptyArgOutChain(newObjInstr,(Instr **)&autoReuseSavedCtorOpnd.autoDelete)
    ;
    hasArgs = !bVar5;
  }
  if (bVar6 == 0) {
    if (local_32 != 0) {
      IR::Instr::InsertBefore(newObjInstr,&helperOrBailoutLabel->super_Instr);
    }
    if (local_33 == true) {
      pLVar11 = (Lowerer *)IR::Instr::New(newObjInstr->m_opcode,func);
      IR::Instr::TransferTo(newObjInstr,(Instr *)pLVar11);
      newObjInstr->m_opcode = BailOut;
      IR::Instr::InsertAfter(newObjInstr,(Instr *)pLVar11);
      local_60 = (Instr *)0x0;
      GenerateBailOut(this,newObjInstr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
      bVar6 = 0;
      newObjInstr = (Instr *)pLVar11;
    }
    else {
      if ((*(byte *)((long)&(this_00->m_lowererMD).FloatPrefThreshold + 3) & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x11ca,"(!newObjDst->CanStoreTemp())","!newObjDst->CanStoreTemp()");
        if (!bVar5) goto LAB_005a5b2f;
        *puVar10 = 0;
      }
      LoadScriptContext(this,newObjInstr);
      if (!callCtor) {
        JVar16 = (uint)(hasArgs ^ 1U) + (uint)(hasArgs ^ 1U) * 2 + HelperNewScObjectNoCtor;
        if (isBaseClassConstructorNewScObject) {
          JVar16 = hasArgs ^ HelperNewScObjectNoArgNoCtorFull;
        }
        if (callCtorLabel == (LabelInstr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x11e1,"(callCtorLabel != nullptr)","callCtorLabel != nullptr");
          if (!bVar5) goto LAB_005a5b2f;
          *puVar10 = 0;
        }
        IR::Instr::InsertAfter(newObjInstr,&callCtorLabel->super_Instr);
        this_03 = (char *)&this->m_lowererMD;
        opndArg = IR::Instr::UnlinkSrc1(newObjInstr);
        LowererMD::LoadHelperArgument((LowererMD *)this_03,newObjInstr,opndArg);
        LowererMD::ChangeToHelperCall
                  ((LowererMD *)this_03,newObjInstr,JVar16,(LabelInstr *)0x0,(Opnd *)0x0,
                   (PropertySymOpnd *)0x0,false);
        if (newObjDst == this_00) {
LAB_005a53fd:
          pIVar9 = RemoveLoweredRegionStartMarker((Lowerer *)this_03,pIVar9);
          return pIVar9;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        this_03 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
        ;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x11e9,"(createObjDst == newObjDst)","createObjDst == newObjDst");
        if (bVar5) {
          *puVar10 = 0;
          goto LAB_005a53fd;
        }
        goto LAB_005a5b2f;
      }
      bVar6 = local_32 | hasArgs;
      LowererMD::LoadHelperArgument(&this->m_lowererMD,newObjInstr,newObjInstr->m_src1);
      pHVar14 = IR::HelperCallOpnd::New(bVar6 + HelperNewScObjectNoArg,func);
      local_60 = IR::Instr::New(Call,(Opnd *)newObjDst,&pHVar14->super_Opnd,func);
      IR::Instr::InsertBefore(newObjInstr,local_60);
      LowererMD::LowerCall(&this->m_lowererMD,local_60,0);
      bVar6 = bVar6 ^ 1;
    }
  }
  else {
    local_60 = (Instr *)0x0;
    bVar6 = 0;
  }
  bVar17 = (local_32 | hasArgs) & callCtor;
  if (bVar18 == 0 && bVar17 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x11f5,"(!skipNewScObj || callCtor)",
                       "What will we return if we skip the default new object and don\'t call the ctor?"
                      );
    if (!bVar5) goto LAB_005a5b2f;
    *puVar10 = 0;
  }
  IR::Instr::InsertBefore(newObjInstr,&callCtorLabel->super_Instr);
  if ((callCtor & local_32) == 1) {
    this_01 = IR::Instr::GetFixedFunction(newObjInstr);
    iVar12 = FixedFieldInfo::GetFuncInfoAddr(this_01);
    if ((hasArgs == false) &&
       ((iVar13 = ThreadContextInfo::GetJavascriptObjectNewInstanceAddr
                            (this->m_func->m_threadContextInfo), iVar12 == iVar13 ||
        (iVar13 = ThreadContextInfo::GetJavascriptArrayNewInstanceAddr
                            (this->m_func->m_threadContextInfo), iVar12 == iVar13)))) {
      iVar13 = ThreadContextInfo::GetJavascriptObjectNewInstanceAddr
                         (this->m_func->m_threadContextInfo);
      if (iVar12 == iVar13) {
        if (local_31 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x1205,"(skipNewScObj)","skipNewScObj");
          if (!bVar5) goto LAB_005a5b2f;
          JVar19 = HelperNewJavascriptObjectNoArg;
LAB_005a54e5:
          *puVar10 = 0;
          bVar17 = 0;
          JVar16 = JVar19;
        }
        else {
          bVar17 = 0;
          JVar16 = HelperNewJavascriptObjectNoArg;
        }
      }
      else {
        iVar13 = ThreadContextInfo::GetJavascriptArrayNewInstanceAddr
                           (this->m_func->m_threadContextInfo);
        JVar19 = HelperNewJavascriptArrayNoArg;
        JVar16 = JnHelperMethodCount;
        if (iVar12 == iVar13) {
          JVar16 = HelperNewJavascriptArrayNoArg;
          bVar17 = 0;
        }
        if (iVar12 == iVar13 && local_31 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x120b,"(skipNewScObj)","skipNewScObj");
          if (!bVar5) goto LAB_005a5b2f;
          goto LAB_005a54e5;
        }
      }
      if (bVar17 == 0) {
        LoadScriptContext(this,newObjInstr);
        pHVar14 = IR::HelperCallOpnd::New(JVar16,func);
        pIVar15 = IR::Instr::New(Call,(Opnd *)this_00,&pHVar14->super_Opnd,func);
        IR::Instr::InsertBefore(newObjInstr,pIVar15);
        LowererMD::LowerCall(&this->m_lowererMD,pIVar15,0);
      }
    }
  }
  local_b0 = (undefined1  [8])0x0;
  autoReuseSavedCtorOpnd.func._1_1_ = 1;
  if (bVar17 == 0) {
    if (*(char *)((long)(((Lowerer *)newObjInstr)->m_lowererMD).lowererMDArch.helperCallArgs + 1) ==
        '\n') {
      EVar7 = JITTimeWorkItem::GetJitMode(this->m_func->m_workItem);
      if (EVar7 != SimpleJit) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x125b,"(m_func->IsSimpleJit())","m_func->IsSimpleJit()");
        if (!bVar5) goto LAB_005a5b2f;
        *puVar10 = 0;
      }
      if (DAT_015bbe4c == '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x125c,"(!(Js::Configuration::Global.flags.NewSimpleJit))",
                           "!CONFIG_FLAG(NewSimpleJit)");
        if (!bVar5) goto LAB_005a5b2f;
        *puVar10 = 0;
      }
      if ((bVar6 != 0) && (OVar4 = IR::Opnd::GetKind((Opnd *)this_02), OVar4 == OpndKindReg)) {
        OVar4 = IR::Opnd::GetKind((Opnd *)this_00);
        if (OVar4 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar5) goto LAB_005a5b2f;
          *puVar10 = 0;
        }
        pFVar2 = (this_00->m_lowererMD).m_func;
        OVar4 = IR::Opnd::GetKind((Opnd *)this_02);
        if (OVar4 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar5) goto LAB_005a5b2f;
          *puVar10 = 0;
        }
        if (pFVar2 == (Func *)this_02->m_sym) {
          EVar7 = JITTimeWorkItem::GetJitMode
                            (((((Lowerer *)newObjInstr)->m_lowererMD).lowererMDArch.m_func)->
                             m_workItem);
          if (EVar7 != SimpleJit) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar10 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x1266,"(newObjInstr->m_func->IsSimpleJit())",
                               "newObjInstr->m_func->IsSimpleJit()");
            if (!bVar5) goto LAB_005a5b2f;
            *puVar10 = 0;
          }
          if (newObjDst == this_00) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar10 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x1267,"(createObjDst != newObjDst)","createObjDst != newObjDst");
            if (!bVar5) goto LAB_005a5b2f;
            *puVar10 = 0;
          }
          opnd = IR::RegOpnd::New((this_02->super_Opnd).m_type,
                                  (((Lowerer *)newObjInstr)->m_lowererMD).lowererMDArch.m_func);
          IR::AutoReuseOpnd::Initialize
                    ((AutoReuseOpnd *)local_b0,&opnd->super_Opnd,
                     (((Lowerer *)newObjInstr)->m_lowererMD).lowererMDArch.m_func,true);
          InsertMove(&opnd->super_Opnd,(Opnd *)this_02,newObjInstr,true);
          this_02 = opnd;
        }
      }
      AVar8 = Js::CallInfo::GetArgCountWithoutExtraArgs(CallFlags_New,1);
      callInfo = IR::IntConstOpnd::New((ulong)AVar8 | 0x1000000,TyInt32,func,true);
      if (local_60 == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1273,"(newScObjCall)","newScObjCall");
        if (!bVar5) goto LAB_005a5b2f;
        *puVar10 = 0;
      }
      if (*(char *)((long)(((Lowerer *)newObjInstr)->m_lowererMD).lowererMDArch.helperCallArgs + 1)
          != '\n') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,199,"(this->IsJitProfilingInstr())","Bad call to AsProfiledInstr()");
        if (!bVar5) goto LAB_005a5b2f;
        *puVar10 = 0;
      }
      GenerateCallProfiling
                (this,*(ProfileId *)
                       ((((Lowerer *)newObjInstr)->m_lowererMD).lowererMDArch.helperCallArgs + 4),
                 *(InlineCacheIndex *)
                  ((long)(((Lowerer *)newObjInstr)->m_lowererMD).lowererMDArch.helperCallArgs + 0x24
                  ),(Opnd *)newObjDst,&this_02->super_Opnd,&callInfo->super_Opnd,false,local_60,
                 newObjInstr);
    }
    if ((newObjDst != this_00) && (local_35 == false)) {
      InsertMove((Opnd *)this_00,(Opnd *)newObjDst,newObjInstr,true);
    }
    IR::Instr::Remove(newObjInstr);
  }
  else {
    pLVar11 = (Lowerer *)&this->m_lowererMD;
    pIVar15 = LowererMD::LoadNewScObjFirstArg
                        ((LowererMD *)pLVar11,newObjInstr,(Opnd *)newObjDst,
                         (ushort)(OVar1 == NewScObjectSpread || OVar1 == NewScObjArraySpread));
    pFVar2 = (((Lowerer *)newObjInstr)->m_lowererMD).m_func;
    if (local_31 == 0) {
      resultObjOpnd = (Lowerer *)IR::RegOpnd::New(TyVar,func);
      IR::Instr::UnlinkDst(newObjInstr);
      IR::Instr::SetDst(newObjInstr,(Opnd *)resultObjOpnd);
      if ((OVar1 == NewScObjectSpread) || (OVar1 == NewScObjArraySpread)) {
        LowerSpreadCall(this,newObjInstr,CallFlags_New,false);
      }
      else {
        LowererMD::LowerCallI((LowererMD *)pLVar11,newObjInstr,1,false,pIVar15);
      }
      if (local_34 == false) {
        LowerGetNewScObjectCommon
                  (this,(RegOpnd *)resultObjOpnd,(RegOpnd *)resultObjOpnd,(RegOpnd *)newObjDst,
                   (Instr *)pFVar2);
        newObjDst = resultObjOpnd;
      }
      pLVar11 = this_00;
      InsertMove((Opnd *)this_00,(Opnd *)newObjDst,(Instr *)pFVar2,true);
    }
    else {
      if ((Lowerer *)(((Lowerer *)newObjInstr)->m_lowererMD).lowererMDArch.helperCallArgs[1] !=
          this_00) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1228,"(newObjInstr->GetDst() == newObjDst)",
                           "newObjInstr->GetDst() == newObjDst");
        if (!bVar5) {
LAB_005a5b2f:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar10 = 0;
      }
      if ((OVar1 == NewScObjectSpread) || (OVar1 == NewScObjArraySpread)) {
        pLVar11 = this;
        LowerSpreadCall(this,newObjInstr,CallFlags_New,false);
      }
      else {
        LowererMD::LowerCallI((LowererMD *)pLVar11,newObjInstr,1,false,pIVar15);
      }
    }
    newObjInstr = (Instr *)pLVar11;
    if (local_32 == 0) {
      LowerUpdateNewScObjectCache(this,(Instr *)pFVar2,(Opnd *)this_00,(Opnd *)this_02,false);
      newObjInstr = (Instr *)this;
    }
  }
  pIVar9 = RemoveLoweredRegionStartMarker((Lowerer *)newObjInstr,pIVar9);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_b0);
  return pIVar9;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScObject(IR::Instr *newObjInstr, bool callCtor, bool hasArgs, bool isBaseClassConstructorNewScObject)
{
    if (newObjInstr->IsJitProfilingInstr() && newObjInstr->AsJitProfilingInstr()->isNewArray)
    {
        Assert(callCtor);
        return LowerProfiledNewArray(newObjInstr->AsJitProfilingInstr(), hasArgs);
    }

    bool isSpreadCall = newObjInstr->m_opcode == Js::OpCode::NewScObjectSpread ||
        newObjInstr->m_opcode == Js::OpCode::NewScObjArraySpread;

    Func* func = newObjInstr->m_func;

    // Insert a temporary label before the instruction we're about to lower, so that we can return
    // the first instruction above that needs to be lowered after we're done - regardless of argument
    // list, StartCall, etc.
    IR::Instr* startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);

    IR::Opnd *ctorOpnd = newObjInstr->GetSrc1();
    IR::RegOpnd *newObjDst = newObjInstr->GetDst()->AsRegOpnd();

    Assert(!callCtor || !hasArgs || (newObjInstr->GetSrc2() != nullptr /*&& newObjInstr->GetSrc2()->IsSymOpnd()*/));

    bool skipNewScObj = false;
    bool returnNewScObj = false;
    bool emitBailOut = false;
    // If we haven't yet split NewScObject into NewScObjectNoCtor and CallI, we will need a temporary register
    // to hold the result of the object allocation.
    IR::RegOpnd* createObjDst = callCtor ? IR::RegOpnd::New(TyVar, func) : newObjDst;
    IR::LabelInstr* helperOrBailoutLabel = IR::LabelInstr::New(Js::OpCode::Label, func, /* isOpHelper = */ true);
    IR::LabelInstr* callCtorLabel = IR::LabelInstr::New(Js::OpCode::Label, func, /* isOpHelper = */ false);

    // Try to emit the fast allocation and construction path.
    bool usedFixedCtorCache = TryLowerNewScObjectWithFixedCtorCache(newObjInstr, createObjDst, helperOrBailoutLabel, callCtorLabel, skipNewScObj, returnNewScObj, emitBailOut);

    AssertMsg(!skipNewScObj || callCtor, "What will we return if we skip the default new object and don't call the ctor?");
    Assert(!skipNewScObj || !returnNewScObj);
    Assert(usedFixedCtorCache || !skipNewScObj);
    Assert(!usedFixedCtorCache || newObjInstr->HasFixedFunctionAddressTarget());
    Assert(!skipNewScObj || !emitBailOut);

#if DBG && 0 // TODO: OOP JIT, enable assert
    if (usedFixedCtorCache)
    {
        Js::JavascriptFunction* ctor = newObjInstr->GetFixedFunction();
        Js::FunctionInfo* ctorInfo = ctor->GetFunctionInfo();
        Assert((ctorInfo->GetAttributes() & Js::FunctionInfo::Attributes::ErrorOnNew) == 0);
        Assert(!!(ctorInfo->GetAttributes() & Js::FunctionInfo::Attributes::SkipDefaultNewObject) == skipNewScObj);
    }
#endif

    IR::Instr* startCallInstr = nullptr;
    if (callCtor && hasArgs)
    {
        hasArgs = !newObjInstr->HasEmptyArgOutChain(&startCallInstr);
    }

    // If we're not skipping the default new object, let's emit bailout or a call to NewScObject* helper
    IR::JnHelperMethod newScHelper = IR::HelperInvalid;
    IR::Instr *newScObjCall = nullptr;
    if (!skipNewScObj)
    {
        // If we emitted the fast path, this block is a helper block.
        if (usedFixedCtorCache)
        {
            newObjInstr->InsertBefore(helperOrBailoutLabel);
        }

        if (emitBailOut)
        {
            IR::Instr* bailOutInstr = newObjInstr;

            newObjInstr = IR::Instr::New(newObjInstr->m_opcode, func);
            bailOutInstr->TransferTo(newObjInstr);
            bailOutInstr->m_opcode = Js::OpCode::BailOut;
            bailOutInstr->InsertAfter(newObjInstr);

            GenerateBailOut(bailOutInstr);
        }
        else
        {
            Assert(!newObjDst->CanStoreTemp());
            // createObjDst = NewScObject...(ctorOpnd)

            LoadScriptContext(newObjInstr);

            if (callCtor)
            {
                newScHelper = (hasArgs || usedFixedCtorCache ? IR::HelperNewScObjectNoCtor : IR::HelperNewScObjectNoArg);

                m_lowererMD.LoadHelperArgument(newObjInstr, newObjInstr->GetSrc1());

                newScObjCall = IR::Instr::New(Js::OpCode::Call, createObjDst, IR::HelperCallOpnd::New(newScHelper, func), func);
                newObjInstr->InsertBefore(newScObjCall);
                m_lowererMD.LowerCall(newScObjCall, 0);
            }
            else
            {
                newScHelper = 
                    (isBaseClassConstructorNewScObject ?
                        (hasArgs ? IR::HelperNewScObjectNoCtorFull : IR::HelperNewScObjectNoArgNoCtorFull) :
                        (hasArgs ? IR::HelperNewScObjectNoCtor : IR::HelperNewScObjectNoArgNoCtor));

                // Branch around the helper call to execute the inlined ctor.
                Assert(callCtorLabel != nullptr);
                newObjInstr->InsertAfter(callCtorLabel);

                // Change the NewScObject* to a helper call on the spot. This generates implicit call bailout for us if we need one.
                m_lowererMD.LoadHelperArgument(newObjInstr, newObjInstr->UnlinkSrc1());
                m_lowererMD.ChangeToHelperCall(newObjInstr, newScHelper);

                // Then we're done.
                Assert(createObjDst == newObjDst);

                // Return the first instruction above the region we've just lowered.
                return RemoveLoweredRegionStartMarker(startMarkerInstr);                    
            }
        }
    }

    // If we call HelperNewScObjectNoArg directly, we won't be calling the constructor from here, because the helper will do it.
    // We could probably avoid this complexity by converting NewScObjectNoArg to NewScObject in the IRBuilder, once we have dedicated
    // code paths for new Object() and new Array().
    callCtor &= hasArgs || usedFixedCtorCache;
    AssertMsg(!skipNewScObj || callCtor, "What will we return if we skip the default new object and don't call the ctor?");

    newObjInstr->InsertBefore(callCtorLabel);

    if (callCtor && usedFixedCtorCache)
    {
        IR::JnHelperMethod ctorHelper = IR::JnHelperMethodCount;

        // If we have no arguments (i.e. the argument chain is empty), we can recognize a couple of common special cases, such
        // as new Object() or new Array(), for which we have optimized helpers.
        FixedFieldInfo* ctor = newObjInstr->GetFixedFunction();
        intptr_t ctorInfo = ctor->GetFuncInfoAddr();
        if (!hasArgs && (ctorInfo == m_func->GetThreadContextInfo()->GetJavascriptObjectNewInstanceAddr() || ctorInfo == m_func->GetThreadContextInfo()->GetJavascriptArrayNewInstanceAddr()))
        {
            if (ctorInfo == m_func->GetThreadContextInfo()->GetJavascriptObjectNewInstanceAddr())
            {
                Assert(skipNewScObj);
                ctorHelper = IR::HelperNewJavascriptObjectNoArg;
                callCtor = false;
            }
            else if (ctorInfo == m_func->GetThreadContextInfo()->GetJavascriptArrayNewInstanceAddr())
            {
                Assert(skipNewScObj);
                ctorHelper = IR::HelperNewJavascriptArrayNoArg;
                callCtor = false;
            }

            if (!callCtor)
            {
                LoadScriptContext(newObjInstr);

                IR::Instr *ctorCall = IR::Instr::New(Js::OpCode::Call, newObjDst,  IR::HelperCallOpnd::New(ctorHelper, func), func);
                newObjInstr->InsertBefore(ctorCall);
                m_lowererMD.LowerCall(ctorCall, 0);
            }
        }
    }

    IR::AutoReuseOpnd autoReuseSavedCtorOpnd;
    if (callCtor)
    {
        // Load the first argument, which is either the object just created or null. Spread has an extra argument.
        IR::Instr * argInstr = this->m_lowererMD.LoadNewScObjFirstArg(newObjInstr, createObjDst, isSpreadCall ? 1 : 0);

        IR::Instr * insertAfterCtorInstr = newObjInstr->m_next;

        if (skipNewScObj)
        {
            // Since we skipped the default new object, we must be returning whatever the constructor returns
            // (which better be an Object), so let's just use newObjDst directly.
            // newObjDst = newObjInstr->m_src1(createObjDst, ...)
            Assert(newObjInstr->GetDst() == newObjDst);
            if (isSpreadCall)
            {
                newObjInstr = this->LowerSpreadCall(newObjInstr, Js::CallFlags_New);
            }
            else
            {
                newObjInstr = this->m_lowererMD.LowerCallI(newObjInstr, Js::CallFlags_New, false, argInstr);
            }
        }
        else
        {
            // We may need to return the default new object or whatever the constructor returns. Let's stash
            // away the constructor's return in a temporary operand, and do the right check, if necessary.
            // ctorResultObjOpnd = newObjInstr->m_src1(createObjDst, ...)
            IR::RegOpnd *ctorResultObjOpnd = IR::RegOpnd::New(TyVar, func);
            newObjInstr->UnlinkDst();
            newObjInstr->SetDst(ctorResultObjOpnd);

            if (isSpreadCall)
            {
                newObjInstr = this->LowerSpreadCall(newObjInstr, Js::CallFlags_New);
            }
            else
            {
                newObjInstr = this->m_lowererMD.LowerCallI(newObjInstr, Js::CallFlags_New, false, argInstr);
            }

            if (returnNewScObj)
            {
                // MOV newObjDst, createObjDst
                this->InsertMove(newObjDst, createObjDst, insertAfterCtorInstr);
            }
            else
            {
                LowerGetNewScObjectCommon(ctorResultObjOpnd, ctorResultObjOpnd, createObjDst, insertAfterCtorInstr);
                this->InsertMove(newObjDst, ctorResultObjOpnd, insertAfterCtorInstr);
            }
        }

        // We don't ever need to update the constructor cache, if we hard coded it.  Caches requiring update after constructor
        // don't get cloned, and those that don't require update will never need one anymore.
        if (!usedFixedCtorCache)
        {
            LowerUpdateNewScObjectCache(insertAfterCtorInstr, newObjDst, ctorOpnd, false /* isCtorFunction */);
        }
    }
    else
    {
        if (newObjInstr->IsJitProfilingInstr())
        {
            Assert(m_func->IsSimpleJit());
            Assert(!CONFIG_FLAG(NewSimpleJit));

            // This path skipped calling the Ctor, which skips calling LowerCallI with newObjInstr, meaning that the call will not be profiled.
            //   So we insert it manually here.

            if(newScHelper == IR::HelperNewScObjectNoArg &&
                newObjDst &&
                ctorOpnd->IsRegOpnd() &&
                newObjDst->AsRegOpnd()->m_sym == ctorOpnd->AsRegOpnd()->m_sym)
            {
                Assert(newObjInstr->m_func->IsSimpleJit());
                Assert(createObjDst != newObjDst);

                // The function object sym is going to be overwritten, so save it in a temp for profiling
                IR::RegOpnd *const savedCtorOpnd = IR::RegOpnd::New(ctorOpnd->GetType(), newObjInstr->m_func);
                autoReuseSavedCtorOpnd.Initialize(savedCtorOpnd, newObjInstr->m_func);
                Lowerer::InsertMove(savedCtorOpnd, ctorOpnd, newObjInstr);
                ctorOpnd = savedCtorOpnd;
            }

            // It is a constructor (CallFlags_New) and therefore a single argument (this) would have been given.
            const auto info = Lowerer::MakeCallInfoConst(Js::CallFlags_New, 1, func);

            Assert(newScObjCall);
            IR::JitProfilingInstr *const newObjJitProfilingInstr = newObjInstr->AsJitProfilingInstr();
            GenerateCallProfiling(
                newObjJitProfilingInstr->profileId,
                newObjJitProfilingInstr->inlineCacheIndex,
                createObjDst,
                ctorOpnd,
                info,
                false,
                newScObjCall,
                newObjInstr);
        }

        // MOV newObjDst, createObjDst
        if (!skipNewScObj && createObjDst != newObjDst)
        {
            this->InsertMove(newObjDst, createObjDst, newObjInstr);
        }
        newObjInstr->Remove();
    }

    // Return the first instruction above the region we've just lowered.
    return RemoveLoweredRegionStartMarker(startMarkerInstr);
}